

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOPofR.cpp
# Opt level: O0

void __thiscall OpenMD::BOPofR::initializeHistogram(BOPofR *this)

{
  reference pvVar1;
  long in_RDI;
  uint i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(uint *)(in_RDI + 0x34); local_c = local_c + 1) {
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x7b8),(ulong)local_c);
    *pvVar1 = 0;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 2000),(ulong)local_c);
    *pvVar1 = 0;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x7e8),(ulong)local_c);
    *pvVar1 = 0;
  }
  return;
}

Assistant:

void BOPofR::initializeHistogram() {
    for (unsigned int i = 0; i < nBins_; i++) {
      RCount_[i] = 0;
      WofR_[i]   = 0;
      QofR_[i]   = 0;
    }
  }